

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabin_karp.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  string local_98 [8];
  string source;
  string local_58;
  allocator local_38 [8];
  string target;
  
  std::__cxx11::string::string(local_98,"sdsafsakobeasdsafsaf",local_38);
  std::__cxx11::string::string
            ((string *)local_38,"kobe",(allocator *)(target.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)(source.field_2._M_local_buf + 8),local_98);
  std::__cxx11::string::string((string *)&local_58,(string *)local_38);
  iVar1 = strStr((string *)((long)&source.field_2 + 8),&local_58);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)(source.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_98);
  return 0;
}

Assistant:

int main()
{
    std::string source = "sdsafsakobeasdsafsaf";
    std::string target = "kobe";
    std::cout<<strStr(source,target)<<std::endl;
}